

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O1

REF_STATUS ref_matrix_imply_m(REF_DBL *m,REF_DBL *xyz0,REF_DBL *xyz1,REF_DBL *xyz2,REF_DBL *xyz3)

{
  double dVar1;
  double dVar2;
  double dVar3;
  REF_STATUS RVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  REF_DBL ab [42];
  double local_158 [4];
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  REF_DBL local_38 [6];
  
  m[4] = 0.0;
  m[5] = 0.0;
  m[2] = 0.0;
  m[3] = 0.0;
  *m = 0.0;
  m[1] = 0.0;
  dVar1 = *xyz1;
  dVar10 = *xyz0;
  dVar6 = dVar1 - dVar10;
  local_158[0] = dVar6 * dVar6;
  dVar2 = xyz1[1];
  dVar11 = xyz0[1];
  dVar8 = dVar2 - dVar11;
  local_128 = (dVar6 + dVar6) * dVar8;
  dVar3 = xyz1[2];
  local_58 = xyz0[2];
  local_68 = dVar3 - local_58;
  local_f8 = (dVar6 + dVar6) * local_68;
  local_c8 = dVar8 * dVar8;
  local_98 = (dVar8 + dVar8) * local_68;
  local_68 = local_68 * local_68;
  dVar6 = *xyz2;
  dVar7 = dVar6 - dVar10;
  local_158[1] = dVar7 * dVar7;
  dVar8 = xyz2[1];
  dVar9 = dVar8 - dVar11;
  local_120 = (dVar7 + dVar7) * dVar9;
  local_50 = xyz2[2];
  local_60 = local_50 - local_58;
  local_f0 = (dVar7 + dVar7) * local_60;
  local_c0 = dVar9 * dVar9;
  local_90 = (dVar9 + dVar9) * local_60;
  local_60 = local_60 * local_60;
  dVar7 = *xyz3;
  dVar10 = dVar7 - dVar10;
  local_158[2] = dVar10 * dVar10;
  dVar9 = xyz3[1];
  dVar11 = dVar9 - dVar11;
  local_118 = (dVar10 + dVar10) * dVar11;
  local_48 = xyz3[2];
  local_58 = local_48 - local_58;
  local_e8 = (dVar10 + dVar10) * local_58;
  local_b8 = dVar11 * dVar11;
  local_88 = (dVar11 + dVar11) * local_58;
  local_58 = local_58 * local_58;
  dVar10 = dVar7 - dVar6;
  dVar6 = dVar6 - dVar1;
  local_158[3] = dVar6 * dVar6;
  dVar11 = dVar9 - dVar8;
  dVar8 = dVar8 - dVar2;
  local_110 = (dVar6 + dVar6) * dVar8;
  local_40 = local_48 - local_50;
  local_50 = local_50 - dVar3;
  local_e0 = (dVar6 + dVar6) * local_50;
  local_b0 = dVar8 * dVar8;
  local_80 = (dVar8 + dVar8) * local_50;
  local_50 = local_50 * local_50;
  dVar7 = dVar7 - dVar1;
  local_138 = dVar7 * dVar7;
  dVar9 = dVar9 - dVar2;
  local_108 = (dVar7 + dVar7) * dVar9;
  local_48 = local_48 - dVar3;
  local_d8 = (dVar7 + dVar7) * local_48;
  local_a8 = dVar9 * dVar9;
  local_78 = (dVar9 + dVar9) * local_48;
  local_48 = local_48 * local_48;
  local_130 = dVar10 * dVar10;
  local_100 = (dVar10 + dVar10) * dVar11;
  local_d0 = (dVar10 + dVar10) * local_40;
  local_a0 = dVar11 * dVar11;
  local_70 = (dVar11 + dVar11) * local_40;
  local_40 = local_40 * local_40;
  lVar5 = 0x24;
  do {
    local_158[lVar5] = 1.0;
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x2a);
  RVar4 = ref_matrix_solve_ab(6,7,local_158);
  if (RVar4 == 0) {
    m[4] = local_38[4];
    m[5] = local_38[5];
    m[2] = local_38[2];
    m[3] = local_38[3];
    *m = local_38[0];
    m[1] = local_38[1];
    RVar4 = 0;
  }
  return RVar4;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_imply_m(REF_DBL *m, REF_DBL *xyz0, REF_DBL *xyz1,
                                      REF_DBL *xyz2, REF_DBL *xyz3) {
  REF_DBL ab[42];
  REF_INT i;

  for (i = 0; i < 6; i++) m[i] = 0.0;

  fill_ab(0, xyz1, xyz0);
  fill_ab(1, xyz2, xyz0);
  fill_ab(2, xyz3, xyz0);
  fill_ab(3, xyz2, xyz1);
  fill_ab(4, xyz3, xyz1);
  fill_ab(5, xyz3, xyz2);

  for (i = 0; i < 6; i++) ab[i + 6 * 6] = 1.0;

  RAISE(ref_matrix_solve_ab(6, 7, ab));

  for (i = 0; i < 6; i++) m[i] = ab[i + 6 * 6];

  return REF_SUCCESS;
}